

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> __thiscall
helics::CallbackFederate::operateCallback(CallbackFederate *this,iteration_time newTime)

{
  iteration_time __args;
  Time newTime_00;
  Time nextStep;
  iteration_time res;
  bool bVar1;
  char in_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar2;
  undefined8 extraout_RDX_03;
  baseType in_RSI;
  function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  *in_RDI;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> pVar3;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> rval;
  IterationRequest *in_stack_fffffffffffffee8;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffef8;
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *in_stack_ffffffffffffff00;
  undefined1 iterating;
  IterationRequest in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff09;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  Federate *in_stack_ffffffffffffff20;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff28;
  IterationRequest in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff31;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> local_a0;
  baseType local_90;
  IterationRequest local_88;
  undefined1 local_79;
  baseType local_78;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> local_70;
  baseType local_60;
  IterationRequest local_58;
  undefined1 local_49;
  baseType local_48;
  baseType local_40;
  baseType local_38;
  long local_30;
  TimeRepresentation<count_time<9,_long>_> local_20;
  char cStack_18;
  uint7 uStack_17;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> local_10;
  
  local_20.internalTimeCode = in_RSI;
  cStack_18 = in_DL;
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                    (&local_20,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if ((bVar1) && (cStack_18 == '\0')) {
    local_38 = local_20.internalTimeCode;
    local_30 = (ulong)uStack_17 << 8;
    res.state = in_stack_ffffffffffffff30;
    res.grantedTime.internalTimeCode = in_stack_ffffffffffffff28.internalTimeCode;
    res._9_7_ = in_stack_ffffffffffffff31;
    Federate::enteringExecutingMode(in_stack_ffffffffffffff20,res);
  }
  else {
    local_40 = local_20.internalTimeCode;
    newTime_00.internalTimeCode._7_1_ = in_stack_ffffffffffffff17;
    newTime_00.internalTimeCode._0_7_ = in_stack_ffffffffffffff10;
    Federate::postTimeRequestOperations
              ((Federate *)CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08),newTime_00,
               SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
  }
  if (((ulong)in_RDI[1].super__Function_base._M_manager & 1) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  local_49 = 0;
  pVar3 = std::make_pair<TimeRepresentation<count_time<9,long>>const,helics::IterationRequest>
                    ((TimeRepresentation<count_time<9,_long>_> *)in_RDI,in_stack_fffffffffffffee8);
  local_60 = (baseType)pVar3.first.internalTimeCode;
  local_58 = pVar3.second;
  local_10.first.internalTimeCode = local_60;
  local_10.second = local_58;
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                    (&local_20,
                     (TimeRepresentation<count_time<9,_long>_> *)
                     ((long)&in_RDI[1].super__Function_base._M_manager +
                     *(long *)(*(long *)&(in_RDI->super__Function_base)._M_functor + -0x18)));
  if (bVar1) {
    local_78 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
    iterating = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
    local_79 = 3;
    pVar3 = std::make_pair<TimeRepresentation<count_time<9,long>>,helics::IterationRequest>
                      ((TimeRepresentation<count_time<9,_long>_> *)in_RDI,in_stack_fffffffffffffee8)
    ;
    local_90 = (baseType)pVar3.first.internalTimeCode;
    local_88 = pVar3.second;
    local_70.first.internalTimeCode = local_90;
    local_70.second = local_88;
    std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>::operator=
              (&local_10,&local_70);
    uVar2 = extraout_RDX;
  }
  else {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
                        *)0x3be763);
    if (bVar1) {
      __args.grantedTime.internalTimeCode._1_7_ = in_stack_ffffffffffffff09;
      __args.grantedTime.internalTimeCode._0_1_ = in_stack_ffffffffffffff08;
      __args._8_7_ = in_stack_ffffffffffffff10;
      __args._15_1_ = in_stack_ffffffffffffff17;
      pVar3 = std::
              function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
              ::operator()(in_stack_ffffffffffffff00,__args);
      iterating = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
      local_a0.first = pVar3.first.internalTimeCode;
      local_a0.second = pVar3.second;
      std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>::operator=
                (&local_10,&local_a0);
      uVar2 = extraout_RDX_00;
    }
    else {
      bVar1 = std::function::operator_cast_to_bool(in_RDI);
      iterating = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
      uVar2 = extraout_RDX_01;
      if (bVar1) {
        std::
        function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
        ::operator()(in_RDI,in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff17 = 0;
        pVar3 = std::make_pair<TimeRepresentation<count_time<9,long>>,helics::IterationRequest>
                          ((TimeRepresentation<count_time<9,_long>_> *)in_RDI,
                           in_stack_fffffffffffffee8);
        iterating = pVar3.first.internalTimeCode._7_1_;
        in_stack_ffffffffffffff08 = pVar3.second;
        std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>::operator=
                  (&local_10,(type)&stack0xffffffffffffff28);
        uVar2 = extraout_RDX_02;
      }
    }
  }
  if ((char)local_10.second < '\x03') {
    nextStep.internalTimeCode._7_1_ = in_stack_ffffffffffffff17;
    nextStep.internalTimeCode._0_7_ = in_stack_ffffffffffffff10;
    Federate::preTimeRequestOperations
              ((Federate *)CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08),nextStep,
               (bool)iterating);
    uVar2 = extraout_RDX_03;
  }
  pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  pVar3.second = local_10.second;
  pVar3.first.internalTimeCode = local_10.first.internalTimeCode;
  return pVar3;
}

Assistant:

std::pair<Time, IterationRequest> CallbackFederate::operateCallback(iteration_time newTime)
{
    if (newTime.grantedTime == timeZero && newTime.state == IterationResult::NEXT_STEP) {
        enteringExecutingMode(newTime);
    } else {
        postTimeRequestOperations(newTime.grantedTime, newTime.state == IterationResult::ITERATING);
    }
    // time zero here is equivalent to the next allowable time
    auto rval = std::make_pair((mEventTriggered) ? Time::maxVal() : timeZero,
                               IterationRequest::NO_ITERATIONS);

    if (newTime.grantedTime >= mStopTime) {
        rval = std::make_pair(Time::maxVal(), IterationRequest::HALT_OPERATIONS);
    } else if (nextTimeOperation1) {
        rval = nextTimeOperation1(newTime);
    } else if (nextTimeOperation2) {
        rval = std::make_pair(nextTimeOperation2(newTime.grantedTime),
                              IterationRequest::NO_ITERATIONS);
    }
    if (rval.second <= IterationRequest::ITERATE_IF_NEEDED) {
        preTimeRequestOperations(rval.first, rval.second != IterationRequest::NO_ITERATIONS);
    }

    return rval;
}